

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineChart.cpp
# Opt level: O1

void __thiscall chart::createWindow(chart *this,uint x,uint y,string *des)

{
  RenderTarget *this_00;
  Text *this_01;
  locale local_90 [8];
  undefined1 local_88 [12];
  float local_7c;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  local_78;
  VideoMode local_68;
  ContextSettings local_58;
  
  local_58.depthBits = 0;
  local_58.stencilBits = 0;
  local_58.minorVersion = 1;
  local_58.attributeFlags = 0;
  local_58.sRgbCapable = false;
  local_58.antialiasingLevel = 3;
  local_58.majorVersion = 1;
  sf::VideoMode::VideoMode(&local_68,x,y,0x20);
  std::locale::locale(local_90);
  sf::String::String((String *)local_88,des,local_90);
  sf::Window::create((Window *)this,local_68,(String *)local_88,1,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity * 4 + 4);
  }
  std::locale::~locale(local_90);
  local_88._8_4_ = (undefined4)x;
  local_7c = (float)y;
  local_88._0_8_ = (pointer)0xc1a00000;
  sf::View::reset(&this->view,(FloatRect *)local_88);
  this_00 = &(this->window).super_RenderTarget;
  sf::RenderTarget::setView(this_00,&this->view);
  sf::RenderTarget::clear(this_00,(Color *)&sf::Color::Black);
  sf::Window::display((Window *)this);
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Roboto-Regular.ttf","");
  sf::Font::loadFromFile(&this->font,(string *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  this_01 = &this->text;
  sf::Text::setFont(this_01,&this->font);
  std::locale::locale(local_90);
  sf::String::String((String *)local_88,"0",local_90);
  sf::Text::setString(this_01,(String *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity * 4 + 4);
  }
  std::locale::~locale(local_90);
  sf::Text::setCharacterSize(this_01,0xe);
  sf::Text::setFillColor(this_01,(Color *)&sf::Color::White);
  return;
}

Assistant:

void chart::createWindow(unsigned x, unsigned y, std::string des)
{
    sf::ContextSettings settings;
    settings.antialiasingLevel = 3;

    window.create(sf::VideoMode(x, y), des, sf::Style::Default || sf::Style::Close, settings);
    view.reset(sf::FloatRect(-20, 0, x, y));
    window.setView(view);

    window.clear(sf::Color::Black);
    window.display();

    font.loadFromFile("Roboto-Regular.ttf");
    text.setFont(font);
    text.setString("0");
    text.setCharacterSize(14);
    text.setFillColor(sf::Color::White);
}